

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_transfer(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ROOM_INDEX_DATA *room;
  CHAR_DATA *pCVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  DESCRIPTOR_DATA **ppDVar6;
  string_view fmt;
  format_args args;
  char *local_2478 [2];
  char *local_2468;
  string buffer;
  char arg2 [4608];
  char arg1 [4608];
  
  pcVar4 = one_argument(argument,arg1);
  one_argument(pcVar4,arg2);
  if (arg1[0] == '\0') {
    pcVar4 = "Transfer whom (and where)?\n\r";
    goto LAB_002c54fd;
  }
  bVar1 = str_cmp(arg1,"all");
  if (!bVar1) {
    ppDVar6 = &descriptor_list;
    while (ppDVar6 = &((DESCRIPTOR_DATA *)ppDVar6)->next->next,
          (DESCRIPTOR_DATA *)ppDVar6 != (DESCRIPTOR_DATA *)0x0) {
      if ((((((DESCRIPTOR_DATA *)ppDVar6)->connected == 0) &&
           (pCVar5 = ((DESCRIPTOR_DATA *)ppDVar6)->character, pCVar5 != ch)) &&
          (pCVar5->in_room != (ROOM_INDEX_DATA *)0x0)) && (bVar1 = can_see(ch,pCVar5), bVar1)) {
        local_2478[0] = ((DESCRIPTOR_DATA *)ppDVar6)->character->name;
        fmt.size_ = 0xcc;
        fmt.data_ = (char *)0x5;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_2478;
        local_2468 = arg2;
        ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)0x3ea493,fmt,args);
        do_transfer(ch,buffer._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&buffer);
      }
    }
    return;
  }
  if (arg2[0] == '\0') {
    room = ch->in_room;
  }
  else {
    room = find_location(ch,arg2);
    if (room == (ROOM_INDEX_DATA *)0x0) {
      pcVar4 = "No such location.\n\r";
      goto LAB_002c54fd;
    }
    if ((((room->room_flags[0] & 0x4000) != 0) && (ch->level < 0x3c)) ||
       ((bVar1 = is_room_owner(ch,room), !bVar1 &&
        ((bVar1 = room_is_private(room), bVar1 && (ch->level < 0x3c)))))) {
      pcVar4 = "Access denied.\n\r";
      goto LAB_002c54fd;
    }
  }
  pCVar5 = get_char_world(ch,arg1);
  if (pCVar5 == (CHAR_DATA *)0x0) {
    pcVar4 = "They aren\'t here.\n\r";
  }
  else if (pCVar5->in_room == (ROOM_INDEX_DATA *)0x0) {
    pcVar4 = "They are in limbo.\n\r";
  }
  else {
    iVar2 = get_trust(pCVar5);
    iVar3 = get_trust(ch);
    if (((iVar2 < iVar3) || (bVar1 = is_npc(pCVar5), bVar1)) || (ch->level == 0x3c)) {
      if (pCVar5->fighting != (CHAR_DATA *)0x0) {
        stop_fighting(pCVar5,true);
      }
      act("$n disappears in a mushroom cloud.",pCVar5,(void *)0x0,(void *)0x0,0);
      char_from_room(pCVar5);
      char_to_room(pCVar5,room);
      act("$n arrives from a puff of smoke.",pCVar5,(void *)0x0,(void *)0x0,0);
      if (pCVar5 != ch) {
        act("$n has transferred you.",ch,(void *)0x0,pCVar5,2);
      }
      do_look(pCVar5,"auto");
      pcVar4 = "Ok.\n\r";
    }
    else {
      pcVar4 = "They are too high for you to mess with.\n\r";
    }
  }
LAB_002c54fd:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_transfer(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	ROOM_INDEX_DATA *location;
	DESCRIPTOR_DATA *d;
	CHAR_DATA *victim;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Transfer whom (and where)?\n\r", ch);
		return;
	}

	if (!str_cmp(arg1, "all"))
	{
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->connected == CON_PLAYING
				&& d->character != ch
				&& d->character->in_room != nullptr
				&& can_see(ch, d->character))
			{
				auto buffer = fmt::format("{} {}", d->character->name, arg2);
				do_transfer(ch, buffer.data());
			}
		}

		return;
	}

	/*
	 * Thanks to Grodyn for the optional location parameter.
	 */
	if (arg2[0] == '\0')
	{
		location = ch->in_room;
	}
	else
	{
		location = find_location(ch, arg2);

		if (location == nullptr)
		{
			send_to_char("No such location.\n\r", ch);
			return;
		}

		if (IS_SET(location->room_flags, ROOM_IMP_ONLY) && ch->level < 60)
		{
			send_to_char("Access denied.\n\r", ch);
			return;
		}

		if (!is_room_owner(ch, location) && room_is_private(location) && ch->level < MAX_LEVEL)
		{
			send_to_char("Access denied.\n\r", ch);
			return;
		}
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim->in_room == nullptr)
	{
		send_to_char("They are in limbo.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch) && !is_npc(victim) && ch->level != 60)
	{
		send_to_char("They are too high for you to mess with.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr)
		stop_fighting(victim, true);

	act("$n disappears in a mushroom cloud.", victim, nullptr, nullptr, TO_ROOM);

	char_from_room(victim);
	char_to_room(victim, location);

	act("$n arrives from a puff of smoke.", victim, nullptr, nullptr, TO_ROOM);

	if (ch != victim)
		act("$n has transferred you.", ch, nullptr, victim, TO_VICT);

	do_look(victim, "auto");

	send_to_char("Ok.\n\r", ch);
}